

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cpp
# Opt level: O3

bool __thiscall
slang::ast::ConstraintExprVisitor::visit<slang::ast::HierarchicalReferenceExpression>
          (ConstraintExprVisitor *this,HierarchicalReferenceExpression *expr)

{
  ExpressionKind EVar1;
  uint uVar2;
  int iVar3;
  variant_alternative_t<0UL,_variant<const_SubroutineSymbol_*,_SystemCallInfo>_> pSVar4;
  size_type sVar5;
  long lVar6;
  Type *pTVar7;
  bool bVar8;
  RandMode RVar9;
  SubroutineKind SVar10;
  Symbol *pSVar11;
  variant_alternative_t<0UL,_variant<const_SubroutineSymbol_*,_SystemCallInfo>_> *ppSVar12;
  Diagnostic *diag;
  SourceLocation SVar13;
  long lVar15;
  DiagCode code;
  ASTContext *this_00;
  SourceRange sourceRange;
  DistVarVisitor distVisitor;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_30;
  uint local_28;
  byte local_23;
  SourceLocation SVar14;
  
  if (this->failed != false) goto LAB_0025663c;
  if (((this->isSoft == true) &&
      (pSVar11 = Expression::getSymbolReference(&expr->super_Expression,true),
      pSVar11 != (Symbol *)0x0)) &&
     (RVar9 = ASTContext::getRandMode(this->context,pSVar11), RVar9 == RandC)) {
    ASTContext::addDiag(this->context,(DiagCode)0x340008,(expr->super_Expression).sourceRange);
  }
  EVar1 = (expr->super_Expression).kind;
  bVar8 = true;
  if (0x14 < (int)EVar1) {
    switch(EVar1) {
    case OpenRange:
      goto switchD_00256525_caseD_1f;
    case Dist:
      local_30 = (anon_union_8_2_628a4eb3_for_SVIntStorage_0)this->context;
      local_28 = local_28 & 0xffffff00;
      pSVar11 = (expr->symbol).ptr;
      Expression::visitExpression<slang::ast::Expression_const,slang::ast::DistVarVisitor&>
                ((Expression *)pSVar11,(Expression *)pSVar11,(DistVarVisitor *)&local_30);
      if ((char)local_28 != '\0') {
        return true;
      }
      ASTContext::addDiag(this->context,(DiagCode)0x370008,*(SourceRange *)&pSVar11->parentScope);
      return true;
    case NewArray:
    case NewClass:
    case CopyClass:
      goto switchD_00256525_caseD_21;
    case NewCovergroup:
      break;
    default:
      if (EVar1 == Call) {
        SVar10 = CallExpression::getSubroutineKind((CallExpression *)expr);
        if (SVar10 == Task) {
          this_00 = this->context;
          SVar14 = (expr->super_Expression).sourceRange.startLoc;
          SVar13 = (expr->super_Expression).sourceRange.endLoc;
          code.subsystem = Statements;
          code.code = 0x44;
          goto LAB_00256633;
        }
        if (*(char *)&expr[1].super_Expression.sourceRange.endLoc != '\x01') {
          ppSVar12 = std::
                     get<0ul,slang::ast::SubroutineSymbol_const*,slang::ast::CallExpression::SystemCallInfo>
                               ((variant<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                                 *)&expr->symbol);
          pSVar4 = *ppSVar12;
          if ((pSVar4->super_Scope).deferredMemberIndex != Invalid) {
            Scope::elaborate(&pSVar4->super_Scope);
          }
          sVar5 = (pSVar4->arguments).size_;
          if (sVar5 != 0) {
            lVar15 = 0;
            do {
              lVar6 = *(long *)((long)(pSVar4->arguments).data_ + lVar15);
              iVar3 = *(int *)(lVar6 + 0x90);
              if (iVar3 == 3) {
                if ((*(byte *)(lVar6 + 0x8c) & 1) == 0) goto LAB_002566f5;
              }
              else if (iVar3 == 1) {
LAB_002566f5:
                this_00 = this->context;
                SVar14 = (expr->super_Expression).sourceRange.startLoc;
                SVar13 = (expr->super_Expression).sourceRange.endLoc;
                code.subsystem = Statements;
                code.code = 0x2d;
                goto LAB_00256633;
              }
              lVar15 = lVar15 + 8;
            } while (sVar5 << 3 != lVar15);
          }
        }
      }
    }
    goto switchD_002564f8_caseD_5;
  }
  switch(EVar1) {
  case IntegerLiteral:
    SVInt::SVInt((SVInt *)&local_30,(SVIntStorage *)(expr + 1));
    goto LAB_002565ce;
  case RealLiteral:
  case TimeLiteral:
    this_00 = this->context;
    SVar14 = (expr->super_Expression).sourceRange.startLoc;
    SVar13 = (expr->super_Expression).sourceRange.endLoc;
    code.subsystem = Statements;
    code.code = 0x2a;
    break;
  case UnbasedUnsizedIntegerLiteral:
    UnbasedUnsizedIntegerLiteral::getValue((UnbasedUnsizedIntegerLiteral *)&local_30);
LAB_002565ce:
    if ((0x40 < local_28 || (local_23 & 1) != 0) && ((void *)local_30.val != (void *)0x0)) {
      operator_delete__(local_30.pVal);
    }
    if ((local_23 & 1) == 0) {
      return true;
    }
    this_00 = this->context;
    SVar14 = (expr->super_Expression).sourceRange.startLoc;
    SVar13 = (expr->super_Expression).sourceRange.endLoc;
    code.subsystem = Statements;
    code.code = 0x49;
    break;
  case NullLiteral:
  case UnboundedLiteral:
  case StringLiteral:
  case NamedValue:
  case HierarchicalValue:
  case UnaryOp:
    goto switchD_002564f8_caseD_5;
  case BinaryOp:
    uVar2 = *(uint *)&(expr->symbol).ptr;
    if ((0x12 < uVar2) || ((0x61800U >> (uVar2 & 0x1f) & 1) == 0)) goto switchD_002564f8_caseD_5;
switchD_00256525_caseD_21:
    this_00 = this->context;
    SVar14 = (expr->super_Expression).sourceRange.startLoc;
    SVar13 = (expr->super_Expression).sourceRange.endLoc;
    code.subsystem = Statements;
    code.code = 0x13;
    break;
  default:
    if (EVar1 == Streaming) goto switchD_00256525_caseD_21;
switchD_002564f8_caseD_5:
    pTVar7 = (expr->super_Expression).type.ptr;
    if (pTVar7 == (Type *)0x0) {
LAB_0025670a:
      assert::assertFailed
                ("ptr",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                 ,0x26,
                 "T slang::not_null<const slang::ast::Type *>::get() const [T = const slang::ast::Type *]"
                );
    }
    bVar8 = Type::isValidForRand(pTVar7,Rand);
    if (bVar8) {
      return true;
    }
    diag = ASTContext::addDiag(this->context,(DiagCode)0x290008,(expr->super_Expression).sourceRange
                              );
    pTVar7 = (expr->super_Expression).type.ptr;
    if (pTVar7 == (Type *)0x0) goto LAB_0025670a;
    ast::operator<<(diag,pTVar7);
    goto LAB_00256638;
  }
LAB_00256633:
  sourceRange.endLoc = SVar13;
  sourceRange.startLoc = SVar14;
  ASTContext::addDiag(this_00,code,sourceRange);
LAB_00256638:
  this->failed = true;
LAB_0025663c:
  bVar8 = false;
switchD_00256525_caseD_1f:
  return bVar8;
}

Assistant:

bool visit(const T& expr) {
        if (failed)
            return false;

        if constexpr (std::is_base_of_v<Expression, T>) {
            if (isSoft) {
                if (auto sym = expr.getSymbolReference()) {
                    RandMode mode = context.getRandMode(*sym);
                    if (mode == RandMode::RandC)
                        context.addDiag(diag::RandCInSoft, expr.sourceRange);
                }
            }

            if constexpr (is_detected_v<ASTDetectors::visitExprs_t, T, ConstraintExprVisitor>) {
                // Inside call and select expressions we don't care about the types.
                // This allows things like selections of associative arrays and built-in methods
                // on arrays of strings to work as long as the actual operators at the top level
                // don't have those types.
                if (expr.kind != ExpressionKind::ElementSelect &&
                    expr.kind != ExpressionKind::MemberAccess &&
                    expr.kind != ExpressionKind::Call) {
                    expr.visitExprs(*this);
                }
            }

            switch (expr.kind) {
                case ExpressionKind::Streaming:
                case ExpressionKind::NewArray:
                case ExpressionKind::NewClass:
                case ExpressionKind::CopyClass:
                    context.addDiag(diag::ExprNotConstraint, expr.sourceRange);
                    return visitInvalid(expr);
                case ExpressionKind::RealLiteral:
                case ExpressionKind::TimeLiteral:
                    context.addDiag(diag::NonIntegralConstraintLiteral, expr.sourceRange);
                    return visitInvalid(expr);
                case ExpressionKind::IntegerLiteral:
                    if (expr.template as<IntegerLiteral>().getValue().hasUnknown()) {
                        context.addDiag(diag::UnknownConstraintLiteral, expr.sourceRange);
                        return visitInvalid(expr);
                    }
                    return true;
                case ExpressionKind::UnbasedUnsizedIntegerLiteral:
                    if (expr.template as<UnbasedUnsizedIntegerLiteral>().getValue().hasUnknown()) {
                        context.addDiag(diag::UnknownConstraintLiteral, expr.sourceRange);
                        return visitInvalid(expr);
                    }
                    return true;
                case ExpressionKind::BinaryOp: {
                    switch (expr.template as<BinaryExpression>().op) {
                        case BinaryOperator::CaseEquality:
                        case BinaryOperator::CaseInequality:
                        case BinaryOperator::WildcardEquality:
                        case BinaryOperator::WildcardInequality:
                            context.addDiag(diag::ExprNotConstraint, expr.sourceRange);
                            return visitInvalid(expr);
                        default:
                            break;
                    }
                    break;
                }
                case ExpressionKind::OpenRange:
                    return true;
                case ExpressionKind::Dist: {
                    // Additional restrictions on dist expressions:
                    // - must contain at least one 'rand' var
                    // - cannot contain any 'randc' vars
                    DistVarVisitor distVisitor(context);
                    auto& left = expr.template as<DistExpression>().left();
                    left.visit(distVisitor);
                    if (!distVisitor.anyRandVars)
                        context.addDiag(diag::RandNeededInDist, left.sourceRange);
                    return true;
                }
                case ExpressionKind::Call: {
                    auto& call = expr.template as<CallExpression>();
                    if (call.getSubroutineKind() == SubroutineKind::Task) {
                        context.addDiag(diag::TaskInConstraint, expr.sourceRange);
                        return visitInvalid(expr);
                    }

                    if (!call.isSystemCall()) {
                        const SubroutineSymbol& sub = *std::get<0>(call.subroutine);
                        for (auto arg : sub.getArguments()) {
                            if (arg->direction == ArgumentDirection::Out ||
                                (arg->direction == ArgumentDirection::Ref &&
                                 !arg->flags.has(VariableFlags::Const))) {
                                context.addDiag(diag::OutRefFuncConstraint, expr.sourceRange);
                                return visitInvalid(expr);
                            }
                        }
                    }
                    break;
                }
                default:
                    break;
            }

            if (!expr.type->isValidForRand(RandMode::Rand)) {
                context.addDiag(diag::NonIntegralConstraintExpr, expr.sourceRange) << *expr.type;
                return visitInvalid(expr);
            }
        }

        return true;
    }